

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O0

Formattable * icu_63::createArrayCopy(Formattable *array,int32_t count)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  undefined4 in_register_00000034;
  UMemory *this;
  Formattable *local_78;
  Formattable *local_58;
  int local_50;
  int32_t i;
  Formattable *result;
  int32_t count_local;
  Formattable *array_local;
  
  uVar2 = (ulong)count;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x70),0);
  this = (UMemory *)(uVar3 + 8);
  if (SUB168(auVar1 * ZEXT816(0x70),8) != 0 || 0xfffffffffffffff7 < uVar3) {
    this = (UMemory *)0xffffffffffffffff;
  }
  puVar4 = (ulong *)UMemory::operator_new__(this,CONCAT44(in_register_00000034,count));
  local_58 = (Formattable *)0x0;
  if (puVar4 != (ulong *)0x0) {
    *puVar4 = uVar2;
    local_58 = (Formattable *)(puVar4 + 1);
    if (uVar2 != 0) {
      local_78 = local_58;
      do {
        Formattable::Formattable(local_78);
        local_78 = local_78 + 1;
      } while (local_78 != local_58 + uVar2);
    }
  }
  if (local_58 != (Formattable *)0x0) {
    for (local_50 = 0; local_50 < count; local_50 = local_50 + 1) {
      Formattable::operator=(local_58 + local_50,array + local_50);
    }
  }
  return local_58;
}

Assistant:

static Formattable* createArrayCopy(const Formattable* array, int32_t count) {
    Formattable *result = new Formattable[count];
    if (result != NULL) {
        for (int32_t i=0; i<count; ++i)
            result[i] = array[i]; // Don't memcpy!
    }
    return result;
}